

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_block.cc
# Opt level: O0

void __thiscall leveldb::FilterBlockBuilder::GenerateFilter(FilterBlockBuilder *this)

{
  long lVar1;
  size_type sVar2;
  reference pvVar3;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  size_t length;
  char *base;
  size_t i;
  size_t num_keys;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  undefined8 *__n;
  Slice *in_stack_ffffffffffffff78;
  vector<leveldb::Slice,_std::allocator<leveldb::Slice>_> *this_00;
  size_type in_stack_ffffffffffffff80;
  vector<leveldb::Slice,_std::allocator<leveldb::Slice>_> *in_stack_ffffffffffffff88;
  ulong local_48;
  char *local_28;
  size_t local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_ffffffffffffff68);
  if (sVar2 == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
              (in_stack_ffffffffffffff68);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff68,
               (value_type_conflict2 *)0xd61244);
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
              (in_stack_ffffffffffffff68);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff68,
               (value_type_conflict5 *)0xd6127d);
    std::vector<leveldb::Slice,_std::allocator<leveldb::Slice>_>::resize
              (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    for (local_48 = 0; local_48 < sVar2; local_48 = local_48 + 1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                (in_stack_ffffffffffffff68);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff78,
                 (size_type)in_stack_ffffffffffffff70);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff78,
                 (size_type)in_stack_ffffffffffffff70);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff78,
                 (size_type)in_stack_ffffffffffffff70);
      Slice::Slice(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                   (size_t)in_stack_ffffffffffffff68);
      pvVar3 = std::vector<leveldb::Slice,_std::allocator<leveldb::Slice>_>::operator[]
                         ((vector<leveldb::Slice,_std::allocator<leveldb::Slice>_> *)
                          in_stack_ffffffffffffff78,(size_type)in_stack_ffffffffffffff70);
      pvVar3->data_ = local_28;
      pvVar3->size_ = local_20;
    }
    __n = in_RDI + 0xf;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
              (in_stack_ffffffffffffff68);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff68,
               (value_type_conflict2 *)0xd61399);
    this_00 = (vector<leveldb::Slice,_std::allocator<leveldb::Slice>_> *)*in_RDI;
    pvVar3 = std::vector<leveldb::Slice,_std::allocator<leveldb::Slice>_>::operator[]
                       (this_00,(size_type)__n);
    (*(code *)(this_00->super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>)._M_impl
              .super__Vector_impl_data._M_start[1].size_)
              (this_00,pvVar3,sVar2 & 0xffffffff,in_RDI + 8);
    std::vector<leveldb::Slice,_std::allocator<leveldb::Slice>_>::clear
              ((vector<leveldb::Slice,_std::allocator<leveldb::Slice>_> *)in_stack_ffffffffffffff68)
    ;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
              (in_stack_ffffffffffffff68);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void FilterBlockBuilder::GenerateFilter() {
  const size_t num_keys = start_.size();
  if (num_keys == 0) {
    // Fast path if there are no keys for this filter
    filter_offsets_.push_back(result_.size());
    return;
  }

  // Make list of keys from flattened key structure
  start_.push_back(keys_.size());  // Simplify length computation
  tmp_keys_.resize(num_keys);
  for (size_t i = 0; i < num_keys; i++) {
    const char* base = keys_.data() + start_[i];
    size_t length = start_[i + 1] - start_[i];
    tmp_keys_[i] = Slice(base, length);
  }

  // Generate filter for current set of keys and append to result_.
  filter_offsets_.push_back(result_.size());
  policy_->CreateFilter(&tmp_keys_[0], static_cast<int>(num_keys), &result_);

  tmp_keys_.clear();
  keys_.clear();
  start_.clear();
}